

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  Options *options_;
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
  local_728;
  Parse local_710;
  allocator<char> local_5a1;
  string local_5a0;
  undefined1 local_580 [8];
  Driver d;
  char **argv_local;
  int argc_local;
  
  d.options = (Options *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"Verona",&local_5a1);
  options_ = verona::options();
  verona::parser();
  verona::passes();
  trieste::Driver::Driver
            ((Driver *)local_580,&local_5a0,&options_->super_Options,&local_710,&local_728);
  CLI::std::
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>::
  ~vector(&local_728);
  trieste::Parse::~Parse(&local_710);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  iVar1 = trieste::Driver::run((Driver *)local_580,argc,(char **)d.options);
  trieste::Driver::~Driver((Driver *)local_580);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
  trieste::Driver d(
    "Verona", &verona::options(), verona::parser(), verona::passes());

  return d.run(argc, argv);
}